

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pca.hpp
# Opt level: O1

void PCA::run_pca(pca_params *params,vector<ggml_tensor_*,_std::allocator<ggml_tensor_*>_> *v_input,
                 vector<ggml_tensor_*,_std::allocator<ggml_tensor_*>_> *v_output)

{
  pointer ppgVar1;
  void *pvVar2;
  uint uVar3;
  long *plVar4;
  char cVar5;
  int iVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  ggml_tensor *pgVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  ggml_tensor *pgVar12;
  size_t sVar13;
  long lVar14;
  long lVar15;
  ulong uVar16;
  char *pcVar17;
  pca_params *ppVar18;
  int iVar19;
  ulong uVar20;
  uint uVar21;
  ggml_tensor *pgVar22;
  int i;
  float d;
  pca_model model;
  uint local_194;
  pca_params *local_190;
  undefined1 *local_188;
  undefined8 uStack_180;
  undefined1 local_178;
  undefined7 uStack_177;
  ggml_tensor *local_168;
  ggml_tensor *local_160;
  ggml_tensor *local_158;
  vector<ggml_tensor_*,_std::allocator<ggml_tensor_*>_> vStack_150;
  vector<float,_std::allocator<float>_> local_138;
  uint local_11c;
  long *local_118;
  long local_110;
  long local_108;
  undefined1 local_100;
  undefined1 local_ff;
  undefined6 *local_f8;
  long local_f0;
  undefined6 local_e8;
  undefined2 uStack_e2;
  undefined6 uStack_e0;
  undefined1 local_da;
  undefined8 local_d8;
  long *local_d0 [2];
  long local_c0 [2];
  long *local_b0 [2];
  long local_a0 [2];
  vector<ggml_tensor_*,_std::allocator<ggml_tensor_*>_> *local_90;
  vector<ggml_tensor_*,_std::allocator<ggml_tensor_*>_> *local_88;
  ulong local_80;
  ulong local_78;
  ggml_tensor *local_70;
  ggml_backend_t local_68;
  ggml_tensor *local_48;
  ggml_tensor *local_40;
  ggml_tensor *local_38;
  
  local_190 = params;
  local_88 = v_output;
  printf("%s: Running PCA...\n","run_pca");
  if ((v_input->super__Vector_base<ggml_tensor_*,_std::allocator<ggml_tensor_*>_>)._M_impl.
      super__Vector_impl_data._M_finish !=
      (v_input->super__Vector_base<ggml_tensor_*,_std::allocator<ggml_tensor_*>_>)._M_impl.
      super__Vector_impl_data._M_start) {
    uVar16 = 0;
    local_90 = v_input;
    do {
      pgVar9 = (ggml_tensor *)&stack0xffffffffffffff98;
      local_70 = (local_88->super__Vector_base<ggml_tensor_*,_std::allocator<ggml_tensor_*>_>).
                 _M_impl.super__Vector_impl_data._M_start[uVar16];
      local_78 = uVar16 + 1;
      ggml_format_name(local_70,"direction.%zu");
      local_190->i_layer = (int)uVar16;
      ppgVar1 = (v_input->super__Vector_base<ggml_tensor_*,_std::allocator<ggml_tensor_*>_>)._M_impl
                .super__Vector_impl_data._M_start;
      local_190->n_layers =
           (int)((ulong)((long)(v_input->
                               super__Vector_base<ggml_tensor_*,_std::allocator<ggml_tensor_*>_>).
                               _M_impl.super__Vector_impl_data._M_finish - (long)ppgVar1) >> 3);
      local_80 = uVar16;
      pca_model::pca_model((pca_model *)pgVar9,ppgVar1[uVar16]);
      uVar7 = ggml_backend_get_default_buffer_type(local_68);
      local_d8 = ggml_gallocr_new(uVar7);
      local_138.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)0x0;
      local_138.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_finish = (pointer)0x0;
      vStack_150.super__Vector_base<ggml_tensor_*,_std::allocator<ggml_tensor_*>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      vStack_150.super__Vector_base<ggml_tensor_*,_std::allocator<ggml_tensor_*>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_158 = (ggml_tensor *)0x0;
      vStack_150.super__Vector_base<ggml_tensor_*,_std::allocator<ggml_tensor_*>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      local_138.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)0x0;
      local_11c = local_190->n_iterations / local_190->n_batch;
      if ((int)local_11c < 1) {
        local_160 = (ggml_tensor *)0x0;
      }
      else {
        local_168 = (ggml_tensor *)0x0;
        local_160 = (ggml_tensor *)0x0;
        ppVar18 = local_190;
        do {
          pcVar17 = "params.n_batch > 0";
          if (ppVar18->n_batch < 1) {
            uVar7 = 0x8a;
LAB_00127c3a:
            ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/examples/cvector-generator/pca.hpp"
                       ,uVar7,"GGML_ASSERT(%s) failed",pcVar17);
          }
          if ((build_graph_piter(PCA::pca_params_const&,PCA::pca_model_const&,bool)::buf_size ==
               '\0') &&
             (iVar19 = __cxa_guard_acquire(&build_graph_piter(PCA::pca_params_const&,PCA::pca_model_const&,bool)
                                            ::buf_size), iVar19 != 0)) {
            lVar14 = ggml_tensor_overhead();
            lVar15 = ggml_graph_overhead();
            build_graph_piter(PCA::pca_params_const&,PCA::pca_model_const&,bool)::buf_size =
                 (undefined1 *)(lVar15 + lVar14 * 0x800);
            __cxa_guard_release(&build_graph_piter(PCA::pca_params_const&,PCA::pca_model_const&,bool)
                                 ::buf_size);
          }
          if ((build_graph_piter(PCA::pca_params_const&,PCA::pca_model_const&,bool)::buf == '\0') &&
             (iVar19 = __cxa_guard_acquire(&build_graph_piter(PCA::pca_params_const&,PCA::pca_model_const&,bool)
                                            ::buf), iVar19 != 0)) {
            std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                      ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                       &build_graph_piter(PCA::pca_params_const&,PCA::pca_model_const&,bool)::buf,
                       (size_type)
                       build_graph_piter(PCA::pca_params_const&,PCA::pca_model_const&,bool)::
                       buf_size,(allocator_type *)&local_188);
            __cxa_atexit(std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector,
                         &build_graph_piter(PCA::pca_params_const&,PCA::pca_model_const&,bool)::buf,
                         &__dso_handle);
            __cxa_guard_release(&build_graph_piter(PCA::pca_params_const&,PCA::pca_model_const&,bool)
                                 ::buf);
          }
          local_188 = build_graph_piter(PCA::pca_params_const&,PCA::pca_model_const&,bool)::buf_size
          ;
          uStack_180 = build_graph_piter(PCA::pca_params_const&,PCA::pca_model_const&,bool)::buf;
          local_178 = 1;
          uVar7 = ggml_init();
          uVar8 = ggml_new_graph(uVar7);
          if ((int)local_168 == 0) {
            pgVar9 = (ggml_tensor *)ggml_mul_mat(uVar7,local_48);
            ggml_set_name(pgVar9,"tmp_square");
          }
          if ((int)local_168 != 0) {
            pgVar9 = local_40;
          }
          if (0 < local_190->n_batch) {
            iVar19 = 0;
            pgVar22 = local_38;
            do {
              uVar10 = ggml_mul_mat(uVar7,pgVar9,pgVar22);
              ggml_set_name(uVar10,"b_tensor");
              uVar11 = ggml_sqr(uVar7,uVar10);
              uVar11 = ggml_sum_rows(uVar7,uVar11);
              uVar11 = ggml_sqrt_inplace(uVar7,uVar11);
              pgVar12 = (ggml_tensor *)ggml_div_inplace(uVar7,uVar10,uVar11);
              ggml_format_name(pgVar12,"b_tensor_norm_%d",iVar19);
              uVar10 = ggml_scale(0xbf800000,uVar7,pgVar12);
              uVar10 = ggml_add(uVar7,pgVar22,uVar10);
              uVar10 = ggml_sqr_inplace(uVar7,uVar10);
              uVar10 = ggml_sum_rows(uVar7,uVar10);
              uVar10 = ggml_sqrt_inplace(uVar7,uVar10);
              ggml_format_name(uVar10,"distance_%d",iVar19);
              ggml_build_forward_expand(uVar8,uVar10);
              iVar19 = iVar19 + 1;
              pgVar22 = pgVar12;
            } while (iVar19 < local_190->n_batch);
          }
          ggml_free(uVar7);
          ggml_gallocr_alloc_graph(local_d8,uVar8);
          cVar5 = ggml_backend_is_cpu(local_68);
          if (cVar5 != '\0') {
            ggml_backend_cpu_set_n_threads(local_68,local_190->n_threads);
          }
          iVar19 = ggml_backend_graph_compute(local_68,uVar8);
          if (iVar19 == 0) {
            local_158 = (ggml_tensor *)0x0;
            if (vStack_150.super__Vector_base<ggml_tensor_*,_std::allocator<ggml_tensor_*>_>._M_impl
                .super__Vector_impl_data._M_finish !=
                vStack_150.super__Vector_base<ggml_tensor_*,_std::allocator<ggml_tensor_*>_>._M_impl
                .super__Vector_impl_data._M_start) {
              vStack_150.super__Vector_base<ggml_tensor_*,_std::allocator<ggml_tensor_*>_>._M_impl.
              super__Vector_impl_data._M_finish =
                   vStack_150.super__Vector_base<ggml_tensor_*,_std::allocator<ggml_tensor_*>_>.
                   _M_impl.super__Vector_impl_data._M_start;
            }
            if (local_138.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                super__Vector_impl_data._M_finish !=
                local_138.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                super__Vector_impl_data._M_start) {
              local_138.super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_finish =
                   local_138.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                   super__Vector_impl_data._M_start;
            }
            std::vector<ggml_tensor_*,_std::allocator<ggml_tensor_*>_>::resize
                      (&vStack_150,(long)local_190->n_batch);
            std::vector<float,_std::allocator<float>_>::resize(&local_138,(long)local_190->n_batch);
            iVar19 = ggml_graph_n_nodes(uVar8);
            if (0 < iVar19) {
              iVar19 = 0;
              do {
                pgVar9 = (ggml_tensor *)ggml_graph_node(uVar8,iVar19);
                local_f8 = &local_e8;
                uStack_e0 = 0x5f6d726f6e5f;
                local_e8 = 0x736e65745f62;
                uStack_e2 = 0x726f;
                local_f0 = 0xe;
                local_da = 0;
                pcVar17 = pgVar9->name;
                local_b0[0] = local_a0;
                sVar13 = strlen(pcVar17);
                std::__cxx11::string::_M_construct<char_const*>
                          ((string *)local_b0,pcVar17,pgVar9->name + sVar13);
                local_194 = 0xffffffff;
                lVar14 = std::__cxx11::string::rfind((char *)local_b0,(ulong)local_f8,0);
                plVar4 = local_b0[0];
                if (lVar14 == 0) {
                  local_188 = &local_178;
                  std::__cxx11::string::_M_construct<char*>
                            ((string *)&local_188,local_f8,local_f0 + (long)local_f8);
                  std::__cxx11::string::append((char *)&local_188);
                  __isoc99_sscanf(plVar4,local_188,&local_194);
                  if (local_188 != &local_178) {
                    operator_delete(local_188,CONCAT71(uStack_177,local_178) + 1);
                  }
                }
                uVar3 = local_194;
                uVar16 = (ulong)local_194;
                if (local_b0[0] != local_a0) {
                  operator_delete(local_b0[0],local_a0[0] + 1);
                }
                if (local_f8 != &local_e8) {
                  operator_delete(local_f8,CONCAT26(uStack_e2,local_e8) + 1);
                }
                if (-1 < (int)uVar3) {
                  vStack_150.super__Vector_base<ggml_tensor_*,_std::allocator<ggml_tensor_*>_>.
                  _M_impl.super__Vector_impl_data._M_start[uVar16] = pgVar9;
                }
                local_118 = &local_108;
                local_108 = 0x65636e6174736964;
                local_100 = 0x5f;
                local_110 = 9;
                local_ff = 0;
                local_d0[0] = local_c0;
                sVar13 = strlen(pcVar17);
                std::__cxx11::string::_M_construct<char_const*>
                          ((string *)local_d0,pcVar17,pcVar17 + sVar13);
                local_194 = 0xffffffff;
                lVar14 = std::__cxx11::string::rfind((char *)local_d0,(ulong)local_118,0);
                plVar4 = local_d0[0];
                if (lVar14 == 0) {
                  local_188 = &local_178;
                  std::__cxx11::string::_M_construct<char*>
                            ((string *)&local_188,local_118,local_110 + (long)local_118);
                  std::__cxx11::string::append((char *)&local_188);
                  __isoc99_sscanf(plVar4,local_188,&local_194);
                  if (local_188 != &local_178) {
                    operator_delete(local_188,CONCAT71(uStack_177,local_178) + 1);
                  }
                }
                uVar3 = local_194;
                uVar16 = (ulong)local_194;
                if (local_d0[0] != local_c0) {
                  operator_delete(local_d0[0],local_c0[0] + 1);
                }
                if (local_118 != &local_108) {
                  operator_delete(local_118,local_108 + 1);
                }
                if (-1 < (int)uVar3) {
                  ggml_backend_tensor_get(pgVar9,&local_188,0,4);
                  local_138.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                  super__Vector_impl_data._M_start[uVar16] = local_188._0_4_;
                }
                local_188 = &local_178;
                sVar13 = strlen(pcVar17);
                std::__cxx11::string::_M_construct<char_const*>
                          ((string *)&local_188,pcVar17,pcVar17 + sVar13);
                iVar6 = std::__cxx11::string::compare((char *)&local_188);
                if (local_188 != &local_178) {
                  operator_delete(local_188,CONCAT71(uStack_177,local_178) + 1);
                }
                if (iVar6 == 0) {
                  local_158 = pgVar9;
                }
                iVar6 = ggml_graph_n_nodes(uVar8);
                iVar19 = iVar19 + 1;
              } while (iVar19 < iVar6);
            }
          }
          if ((long)local_138.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_finish -
              (long)local_138.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_start != 0) {
            uVar16 = 1;
            do {
              uVar20 = uVar16;
              if (local_138.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                  super__Vector_impl_data._M_start[uVar20 - 1] <= local_190->tolerance &&
                  local_190->tolerance !=
                  local_138.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                  super__Vector_impl_data._M_start[uVar20 - 1]) break;
              uVar16 = uVar20 + 1;
            } while (uVar20 < (ulong)((long)local_138.
                                            super__Vector_base<float,_std::allocator<float>_>.
                                            _M_impl.super__Vector_impl_data._M_finish -
                                      (long)local_138.
                                            super__Vector_base<float,_std::allocator<float>_>.
                                            _M_impl.super__Vector_impl_data._M_start >> 2));
            local_160 = vStack_150.super__Vector_base<ggml_tensor_*,_std::allocator<ggml_tensor_*>_>
                        ._M_impl.super__Vector_impl_data._M_start[uVar20 - 1];
          }
          if ((int)local_168 == 0) {
            if (local_158 == (ggml_tensor *)0x0) {
              uVar7 = 0x110;
              pcVar17 = "result.calculated_square != NULL";
              goto LAB_00127c3a;
            }
            ggml_backend_tensor_copy(local_158,local_40);
          }
          if (local_160 == (ggml_tensor *)0x0) {
            uVar7 = 0x116;
            pcVar17 = "last_eigenvector != NULL";
            goto LAB_00127c3a;
          }
          ggml_backend_tensor_copy(local_160,local_38);
          uVar3 = local_11c;
          ppVar18 = local_190;
          uVar21 = (int)local_168 + 1;
          pgVar9 = (ggml_tensor *)(ulong)uVar21;
          printf("%s: layer %d/%d, iteration: %d / total: %d (batch = %d) ...\n","power_iteration",
                 (ulong)(local_190->i_layer + 1),(ulong)(uint)local_190->n_layers,pgVar9,
                 (ulong)local_11c,local_190->n_batch);
          local_168 = pgVar9;
        } while (uVar21 != uVar3);
      }
      pgVar9 = local_160;
      if (local_160 == (ggml_tensor *)0x0) {
        ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/examples/cvector-generator/pca.hpp"
                   ,0x11f,"GGML_ASSERT(%s) failed","last_eigenvector");
      }
      pvVar2 = local_70->data;
      uVar7 = ggml_nbytes(local_160);
      ggml_backend_tensor_get(pgVar9,pvVar2,0,uVar7);
      ggml_gallocr_free(local_d8);
      if (local_138.super__Vector_base<float,_std::allocator<float>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_138.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_138.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)local_138.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                              super__Vector_impl_data._M_start);
      }
      if (vStack_150.super__Vector_base<ggml_tensor_*,_std::allocator<ggml_tensor_*>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(vStack_150.super__Vector_base<ggml_tensor_*,_std::allocator<ggml_tensor_*>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (long)vStack_150.
                              super__Vector_base<ggml_tensor_*,_std::allocator<ggml_tensor_*>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)vStack_150.
                              super__Vector_base<ggml_tensor_*,_std::allocator<ggml_tensor_*>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
      pca_model::~pca_model((pca_model *)&stack0xffffffffffffff98);
      v_input = local_90;
      printf("%s: Done layer %d / %d\n","run_pca",(ulong)((int)local_80 + 1),
             (ulong)((long)(local_90->
                           super__Vector_base<ggml_tensor_*,_std::allocator<ggml_tensor_*>_>).
                           _M_impl.super__Vector_impl_data._M_finish -
                    (long)(local_90->
                          super__Vector_base<ggml_tensor_*,_std::allocator<ggml_tensor_*>_>)._M_impl
                          .super__Vector_impl_data._M_start) >> 3);
      uVar16 = local_78;
    } while (local_78 <
             (ulong)((long)(v_input->
                           super__Vector_base<ggml_tensor_*,_std::allocator<ggml_tensor_*>_>).
                           _M_impl.super__Vector_impl_data._M_finish -
                     (long)(v_input->
                           super__Vector_base<ggml_tensor_*,_std::allocator<ggml_tensor_*>_>).
                           _M_impl.super__Vector_impl_data._M_start >> 3));
  }
  return;
}

Assistant:

static void run_pca(
        struct pca_params & params,
        const std::vector<struct ggml_tensor *> & v_input, // shape of v_input[0]: [n_samples, n_embd]
        const std::vector<struct ggml_tensor *> & v_output) {
    printf("%s: Running PCA...\n", __func__);
    for (size_t il = 0; il < v_input.size(); ++il) {

        // prepare output vector
        struct ggml_tensor * ctrl_out = v_output[il];
        ggml_format_name(ctrl_out, "direction.%zu", il+1);

        // run power_iteration
        params.i_layer = il;
        params.n_layers = v_input.size();
        power_iteration(params, v_input[il], ctrl_out);
        printf("%s: Done layer %d / %d\n", __func__, (int) il+1, (int) v_input.size());
    }
}